

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  uint32 uVar2;
  void *pvVar3;
  FileOptions *pFVar4;
  SourceCodeInfo *pSVar5;
  SourceCodeInfo *pSVar6;
  ulong uVar7;
  UnknownFieldSet *other_00;
  Arena *pAVar8;
  Arena *arena;
  ArenaStringPtr *pAVar9;
  string *psVar10;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar3 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) != 0) {
LAB_00293a6a:
      other_00 = (UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
      goto LAB_00293a72;
    }
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_00293a6a;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
LAB_00293a72:
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(other->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(other->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(other->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  pAVar1 = &this->name_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar7 = (ulong)arena & 1;
  pAVar8 = arena;
  if (uVar7 != 0) {
    pAVar8 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar9 = &other->name_;
  psVar10 = pAVar1->ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar9->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar10 = pAVar1->ptr_;
      goto LAB_00293b45;
    }
  }
  else {
LAB_00293b45:
    if (pAVar9->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar9,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar10);
    arena = (Arena *)this_00->ptr_;
    uVar7 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->package_;
  pAVar8 = arena;
  if (uVar7 != 0) {
    pAVar8 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar9 = &other->package_;
  psVar10 = pAVar1->ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar9->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar10 = pAVar1->ptr_;
      goto LAB_00293bce;
    }
  }
  else {
LAB_00293bce:
    if (pAVar9->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar9,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar10);
    arena = (Arena *)this_00->ptr_;
    uVar7 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->syntax_;
  if (uVar7 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar9 = &other->syntax_;
  psVar10 = pAVar1->ptr_;
  if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar9->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_00293c76;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar10 = pAVar1->ptr_;
  }
  if (pAVar9->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar9,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar10);
LAB_00293c76:
  pFVar4 = this->options_;
  pSVar5 = this->source_code_info_;
  pSVar6 = other->source_code_info_;
  this->options_ = other->options_;
  this->source_code_info_ = pSVar6;
  other->options_ = pFVar4;
  other->source_code_info_ = pSVar5;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileDescriptorProto, source_code_info_)
      + sizeof(FileDescriptorProto::source_code_info_)
      - PROTOBUF_FIELD_OFFSET(FileDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}